

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_filter_pushdown_optimizer.cpp
# Opt level: O1

void duckdb::JoinFilterPushdownOptimizer::GetPushdownFilterTargets
               (LogicalOperator *op,vector<duckdb::JoinFilterPushdownColumn,_true> *columns,
               vector<duckdb::PushdownFilterTarget,_true> *targets)

{
  LogicalOperatorType LVar1;
  pointer pJVar2;
  idx_t iVar3;
  JoinFilterPushdownColumn *filter_1;
  LogicalProjection *pLVar4;
  pointer pJVar5;
  pointer pLVar6;
  reference pvVar7;
  type pLVar8;
  reference pvVar9;
  LogicalGet *__args;
  LogicalUnnest *pLVar10;
  LogicalAggregate *pLVar11;
  reference pvVar12;
  type pEVar13;
  BoundColumnRefExpression *pBVar14;
  JoinFilterPushdownColumn *filter_2;
  pointer this;
  JoinFilterPushdownColumn *filter;
  JoinFilterPushdownColumn *child_column;
  vector<duckdb::JoinFilterPushdownColumn,_true> *__range3;
  vector<duckdb::JoinFilterPushdownColumn,_true> child_columns;
  JoinFilterPushdownColumn new_col;
  vector<duckdb::ColumnBinding,_true> child_bindings;
  undefined1 local_118 [16];
  JoinFilterPushdownColumn *local_108;
  pointer local_100;
  vector<duckdb::JoinFilterPushdownColumn,_true> local_f8;
  JoinFilterPushdownColumn local_d8;
  vector<duckdb::JoinFilterPushdownColumn,_true> local_c8;
  vector<duckdb::JoinFilterPushdownColumn,_true> local_a8;
  vector<duckdb::JoinFilterPushdownColumn,_true> local_88;
  vector<duckdb::JoinFilterPushdownColumn,_true> local_68;
  vector<duckdb::ColumnBinding,_true> local_48;
  
  LVar1 = op->type;
  if (LVar1 < LOGICAL_COMPARISON_JOIN) {
    switch(LVar1) {
    case LOGICAL_PROJECTION:
      pLVar4 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
      pJVar5 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar2 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pJVar5 != pJVar2) {
        do {
          if ((pJVar5->probe_column_index).table_index != pLVar4->table_index) {
            return;
          }
          pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&(pLVar4->super_LogicalOperator).expressions,
                                 (pJVar5->probe_column_index).column_index);
          pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar12);
          if ((pEVar13->super_BaseExpression).type != BOUND_COLUMN_REF) {
            return;
          }
          pBVar14 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                              (&pEVar13->super_BaseExpression);
          iVar3 = (pBVar14->binding).column_index;
          (pJVar5->probe_column_index).table_index = (pBVar14->binding).table_index;
          (pJVar5->probe_column_index).column_index = iVar3;
          pJVar5 = pJVar5 + 1;
        } while (pJVar5 != pJVar2);
      }
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar9);
      local_a8.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a8.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetPushdownFilterTargets(pLVar8,&local_a8,targets);
      pJVar5 = local_a8.
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               .
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      break;
    case LOGICAL_FILTER:
    case LOGICAL_LIMIT:
    case LOGICAL_ORDER_BY:
    case LOGICAL_TOP_N:
    case LOGICAL_DISTINCT:
      goto switchD_0118947b_caseD_2;
    case LOGICAL_AGGREGATE_AND_GROUP_BY:
      pLVar11 = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
      pJVar5 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar2 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pJVar5 != pJVar2) {
        do {
          if ((pJVar5->probe_column_index).table_index != pLVar11->group_index) {
            return;
          }
          pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&pLVar11->groups,(pJVar5->probe_column_index).column_index);
          pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar12);
          if ((pEVar13->super_BaseExpression).type != BOUND_COLUMN_REF) {
            return;
          }
          pBVar14 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                              (&pEVar13->super_BaseExpression);
          iVar3 = (pBVar14->binding).column_index;
          (pJVar5->probe_column_index).table_index = (pBVar14->binding).table_index;
          (pJVar5->probe_column_index).column_index = iVar3;
          pJVar5 = pJVar5 + 1;
        } while (pJVar5 != pJVar2);
      }
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar9);
      local_c8.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c8.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c8.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetPushdownFilterTargets(pLVar8,&local_c8,targets);
      pJVar5 = local_c8.
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               .
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      break;
    case LOGICAL_WINDOW:
    case LOGICAL_TOP_N|LOGICAL_PROJECTION:
    case LOGICAL_COPY_TO_FILE:
      goto switchD_0118947b_caseD_4;
    case LOGICAL_UNNEST:
      pLVar10 = LogicalOperator::Cast<duckdb::LogicalUnnest>(op);
      pJVar5 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar2 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pJVar5 != pJVar2) {
        do {
          if ((pJVar5->probe_column_index).table_index == pLVar10->unnest_index) {
            return;
          }
          pJVar5 = pJVar5 + 1;
        } while (pJVar5 != pJVar2);
      }
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar9);
      local_88.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      .
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (columns->
           super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ).
           super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (columns->
      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ).
      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetPushdownFilterTargets(pLVar8,&local_88,targets);
      pJVar5 = local_88.
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               .
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      break;
    default:
      if (LVar1 != LOGICAL_GET) {
        return;
      }
      __args = LogicalOperator::Cast<duckdb::LogicalGet>(op);
      if ((__args->function).filter_pushdown != true) {
        return;
      }
      pJVar5 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar2 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pJVar5 != pJVar2) {
        do {
          if ((pJVar5->probe_column_index).table_index != __args->table_index) {
            return;
          }
          pJVar5 = pJVar5 + 1;
        } while (pJVar5 != pJVar2);
      }
      ::std::vector<duckdb::PushdownFilterTarget,std::allocator<duckdb::PushdownFilterTarget>>::
      emplace_back<duckdb::LogicalGet&,duckdb::vector<duckdb::JoinFilterPushdownColumn,true>>
                ((vector<duckdb::PushdownFilterTarget,std::allocator<duckdb::PushdownFilterTarget>>
                  *)targets,__args,columns);
      return;
    }
  }
  else {
    if (LVar1 - 0x4b < 3) {
      pJVar5 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pJVar2 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pJVar5 != pJVar2) {
        do {
          if ((_func_int **)(pJVar5->probe_column_index).table_index != op[1]._vptr_LogicalOperator)
          {
            return;
          }
          pJVar5 = pJVar5 + 1;
        } while (pJVar5 != pJVar2);
      }
      this = (op->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      local_100 = (op->children).
                  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (this == local_100) {
        return;
      }
      while( true ) {
        local_118 = (undefined1  [16])0x0;
        local_108 = (JoinFilterPushdownColumn *)0x0;
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(this);
        (*pLVar6->_vptr_LogicalOperator[2])(&local_48,pLVar6);
        ::std::
        vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ::reserve((vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                   *)local_118,
                  (long)(columns->
                        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                        ).
                        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(columns->
                        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                        ).
                        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
        pJVar2 = (columns->
                 super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                 ).
                 super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pJVar5 = (columns->
                      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ).
                      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ._M_impl.super__Vector_impl_data._M_start; pJVar5 != pJVar2;
            pJVar5 = pJVar5 + 1) {
          local_d8.probe_column_index.table_index = 0xffffffffffffffff;
          local_d8.probe_column_index.column_index = 0xffffffffffffffff;
          pvVar7 = vector<duckdb::ColumnBinding,_true>::operator[]
                             (&local_48,(pJVar5->probe_column_index).column_index);
          local_d8.probe_column_index.table_index = pvVar7->table_index;
          local_d8.probe_column_index.column_index = pvVar7->column_index;
          if ((JoinFilterPushdownColumn *)local_118._8_8_ == local_108) {
            ::std::
            vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>
            ::_M_realloc_insert<duckdb::JoinFilterPushdownColumn_const&>
                      ((vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>
                        *)local_118,(iterator)local_118._8_8_,&local_d8);
          }
          else {
            iVar3 = pvVar7->column_index;
            ((ColumnBinding *)local_118._8_8_)->table_index = pvVar7->table_index;
            ((ColumnBinding *)local_118._8_8_)->column_index = iVar3;
            local_118._8_8_ = (JoinFilterPushdownColumn *)(local_118._8_8_ + 0x10);
          }
        }
        pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(this);
        local_f8.
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._0_8_;
        local_f8.
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
        local_f8.
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_108;
        local_118 = (undefined1  [16])0x0;
        local_108 = (JoinFilterPushdownColumn *)0x0;
        GetPushdownFilterTargets(pLVar8,&local_f8,targets);
        if (local_f8.
            super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            .
            super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.
                          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                          .
                          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        LVar1 = op->type;
        if (local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          .
                          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_118._0_8_ != (void *)0x0) {
          operator_delete((void *)local_118._0_8_);
        }
        if (LVar1 == LOGICAL_EXCEPT) break;
        this = this + 1;
        if (this == local_100) {
          return;
        }
      }
      return;
    }
    if ((LVar1 != LOGICAL_CROSS_PRODUCT) && (LVar1 != LOGICAL_COMPARISON_JOIN)) {
      return;
    }
switchD_0118947b_caseD_2:
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar9);
    local_68.
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    .
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (columns->
         super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ).
         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    .
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (columns->
         super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ).
         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    .
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (columns->
         super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ).
         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (columns->
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ).
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (columns->
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ).
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (columns->
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ).
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetPushdownFilterTargets(pLVar8,&local_68,targets);
    pJVar5 = local_68.
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             .
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pJVar5 != (pointer)0x0) {
    operator_delete(pJVar5);
  }
switchD_0118947b_caseD_4:
  return;
}

Assistant:

void JoinFilterPushdownOptimizer::GetPushdownFilterTargets(LogicalOperator &op,
                                                           vector<JoinFilterPushdownColumn> columns,
                                                           vector<PushdownFilterTarget> &targets) {
	auto &probe_child = op;
	switch (probe_child.type) {
	case LogicalOperatorType::LOGICAL_LIMIT:
	case LogicalOperatorType::LOGICAL_FILTER:
	case LogicalOperatorType::LOGICAL_ORDER_BY:
	case LogicalOperatorType::LOGICAL_TOP_N:
	case LogicalOperatorType::LOGICAL_DISTINCT:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		// does not affect probe side - recurse into left child
		// FIXME: we can probably recurse into more operators here (e.g. window, unnest)
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	case LogicalOperatorType::LOGICAL_UNNEST: {
		auto &unnest = probe_child.Cast<LogicalUnnest>();
		// check if the filters apply to the unnest index
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index == unnest.unnest_index) {
				// the filter applies to the unnest index - bail out
				return;
			}
		}
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	}
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_UNION: {
		auto &setop = probe_child.Cast<LogicalSetOperation>();
		// union
		// check if the filters apply to this table index
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != setop.table_index) {
				// the filter does not apply to the union - bail-out
				return;
			}
		}
		for (auto &child : probe_child.children) {
			// rewrite the filters for each of the children of the union
			vector<JoinFilterPushdownColumn> child_columns;
			auto child_bindings = child->GetColumnBindings();
			child_columns.reserve(columns.size());
			for (auto &child_column : columns) {
				JoinFilterPushdownColumn new_col;
				new_col.probe_column_index = child_bindings[child_column.probe_column_index.column_index];
				child_columns.push_back(new_col);
			}
			// then recurse into the child
			GetPushdownFilterTargets(*child, std::move(child_columns), targets);

			// for EXCEPT we can only recurse into the first (left) child
			if (probe_child.type == LogicalOperatorType::LOGICAL_EXCEPT) {
				break;
			}
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_GET: {
		// found LogicalGet
		auto &get = probe_child.Cast<LogicalGet>();
		if (!get.function.filter_pushdown) {
			// filter pushdown is not supported - no need to consider this node
			return;
		}
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != get.table_index) {
				// the filter does not apply to the probe side here - bail-out
				return;
			}
		}
		targets.emplace_back(get, std::move(columns));
		break;
	}
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		// projection - check if we all of the expressions are only column references
		auto &proj = probe_child.Cast<LogicalProjection>();
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != proj.table_index) {
				// index does not belong to this projection - bail-out
				return;
			}
			auto &expr = *proj.expressions[filter.probe_column_index.column_index];
			if (!PushdownJoinFilterExpression(expr, filter)) {
				// cannot push through this expression - bail-out
				return;
			}
		}
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	}
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY: {
		// we can push filters through aggregates IF they all point to groups
		auto &aggr = probe_child.Cast<LogicalAggregate>();
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != aggr.group_index) {
				// index does not refer to a group - bail-out
				return;
			}
			auto &expr = *aggr.groups[filter.probe_column_index.column_index];
			if (!PushdownJoinFilterExpression(expr, filter)) {
				// cannot push through this expression - bail-out
				return;
			}
		}
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	}
	default:
		// unsupported child type
		break;
	}
}